

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall despot::util::tinyxml::TiXmlElement::Print(TiXmlElement *this,FILE *cfile,int depth)

{
  TiXmlNode *pTVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TiXmlNode *local_30;
  TiXmlNode *node;
  TiXmlAttribute *attrib;
  int i;
  int depth_local;
  FILE *cfile_local;
  TiXmlElement *this_local;
  
  if (cfile != (FILE *)0x0) {
    for (attrib._0_4_ = 0; (int)attrib < depth; attrib._0_4_ = (int)attrib + 1) {
      fprintf((FILE *)cfile,"    ");
    }
    pcVar3 = TiXmlString::c_str(&(this->super_TiXmlNode).value);
    fprintf((FILE *)cfile,"<%s",pcVar3);
    for (node = (TiXmlNode *)TiXmlAttributeSet::First(&this->attributeSet); node != (TiXmlNode *)0x0
        ; node = (TiXmlNode *)TiXmlAttribute::Next((TiXmlAttribute *)node)) {
      fprintf((FILE *)cfile," ");
      (*(node->super_TiXmlBase)._vptr_TiXmlBase[2])(node,cfile,(ulong)(uint)depth);
    }
    if ((this->super_TiXmlNode).firstChild == (TiXmlNode *)0x0) {
      fprintf((FILE *)cfile," />");
    }
    else if (((this->super_TiXmlNode).firstChild == (this->super_TiXmlNode).lastChild) &&
            (iVar2 = (*(((this->super_TiXmlNode).firstChild)->super_TiXmlBase)._vptr_TiXmlBase[0xe])
                               (), CONCAT44(extraout_var,iVar2) != 0)) {
      fprintf((FILE *)cfile,">");
      pTVar1 = (this->super_TiXmlNode).firstChild;
      (*(pTVar1->super_TiXmlBase)._vptr_TiXmlBase[2])(pTVar1,cfile,(ulong)(depth + 1));
      pcVar3 = TiXmlString::c_str(&(this->super_TiXmlNode).value);
      fprintf((FILE *)cfile,"</%s>",pcVar3);
    }
    else {
      fprintf((FILE *)cfile,">");
      for (local_30 = (this->super_TiXmlNode).firstChild; local_30 != (TiXmlNode *)0x0;
          local_30 = TiXmlNode::NextSibling(local_30)) {
        iVar2 = (*(local_30->super_TiXmlBase)._vptr_TiXmlBase[0xe])();
        if (CONCAT44(extraout_var_00,iVar2) == 0) {
          fprintf((FILE *)cfile,"\n");
        }
        (*(local_30->super_TiXmlBase)._vptr_TiXmlBase[2])(local_30,cfile,(ulong)(depth + 1));
      }
      fprintf((FILE *)cfile,"\n");
      for (attrib._0_4_ = 0; (int)attrib < depth; attrib._0_4_ = (int)attrib + 1) {
        fprintf((FILE *)cfile,"    ");
      }
      pcVar3 = TiXmlString::c_str(&(this->super_TiXmlNode).value);
      fprintf((FILE *)cfile,"</%s>",pcVar3);
    }
    return;
  }
  __assert_fail("cfile",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                ,0x288,"virtual void despot::util::tinyxml::TiXmlElement::Print(FILE *, int) const")
  ;
}

Assistant:

void TiXmlElement::Print(FILE* cfile, int depth) const {
	int i;
	assert(cfile);
	for (i = 0; i < depth; i++) {
		fprintf(cfile, "    ");
	}

	fprintf(cfile, "<%s", value.c_str());

	const TiXmlAttribute* attrib;
	for (attrib = attributeSet.First(); attrib; attrib = attrib->Next()) {
		fprintf(cfile, " ");
		attrib->Print(cfile, depth);
	}

	// There are 3 different formatting approaches:
	// 1) An element without children is printed as a <foo /> node
	// 2) An element with only a text child is printed as <foo> text </foo>
	// 3) An element with children is printed on multiple lines.
	TiXmlNode* node;
	if (!firstChild) {
		fprintf(cfile, " />");
	} else if (firstChild == lastChild && firstChild->ToText()) {
		fprintf(cfile, ">");
		firstChild->Print(cfile, depth + 1);
		fprintf(cfile, "</%s>", value.c_str());
	} else {
		fprintf(cfile, ">");

		for (node = firstChild; node; node = node->NextSibling()) {
			if (!node->ToText()) {
				fprintf(cfile, "\n");
			}
			node->Print(cfile, depth + 1);
		}
		fprintf(cfile, "\n");
		for (i = 0; i < depth; ++i) {
			fprintf(cfile, "    ");
		}
		fprintf(cfile, "</%s>", value.c_str());
	}
}